

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfor2008.h
# Opt level: O0

uint32_t FastPForLib::PFor2008::determineBestBase(DATATYPE *in,size_t size,uint32_t maxb)

{
  uint uVar1;
  uint32_t uVar2;
  reference pvVar3;
  uint in_EDX;
  allocator_type *in_RSI;
  long in_RDI;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 in_ZMM1 [64];
  double thiscost;
  double altErate;
  uint32_t b;
  double bestcost;
  double Erate;
  uint32_t numberofexceptions;
  uint32_t bestb;
  uint32_t k;
  uint32_t rstart;
  vector<unsigned_int,_std::allocator<unsigned_int>_> freqs;
  size_t samplesize;
  size_t defaultsamplesize;
  uint local_ac;
  allocator_type *__a;
  size_type in_stack_ffffffffffffff68;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff70;
  uint local_84;
  double local_80;
  double local_78;
  int local_6c;
  uint local_68;
  uint local_64;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  allocator_type *local_30;
  undefined8 local_28;
  uint local_1c;
  allocator_type *local_18;
  long local_10;
  uint local_4;
  
  if (in_RSI == (allocator_type *)0x0) {
    local_4 = 0;
  }
  else {
    local_28 = 0x10000;
    __a = in_RSI;
    if ((allocator_type *)0x10000 < in_RSI) {
      __a = (allocator_type *)0x10000;
    }
    local_30 = __a;
    local_1c = in_EDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x153798);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,__a);
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x1537b8);
    if (local_30 < local_18) {
      uVar1 = rand();
      local_ac = (uint)((ulong)uVar1 % ((long)local_18 - (long)local_30 & 0xffffffffU));
    }
    else {
      local_ac = 0;
    }
    for (local_64 = local_ac; (allocator_type *)(ulong)local_64 < local_30 + local_ac;
        local_64 = local_64 + 1) {
      uVar2 = asmbits(*(uint32_t *)(local_10 + (ulong)local_64 * 4));
      pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&local_48,(ulong)uVar2);
      *pvVar3 = *pvVar3 + 1;
    }
    local_68 = local_1c;
    local_6c = 0;
    auVar7 = vcvtusi2sd_avx512f((undefined1  [16])0x0,local_1c);
    local_80 = auVar7._0_8_;
    uVar1 = local_1c;
    while( true ) {
      local_84 = uVar1 - 1;
      auVar6 = in_ZMM1._0_16_;
      if (local_1c <= local_84) break;
      pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&local_48,(ulong)uVar1);
      local_6c = *pvVar3 + local_6c;
      auVar7 = vcvtusi2sd_avx512f(auVar7,local_6c);
      auVar6 = vcvtusi2sd_avx512f(auVar6,local_30);
      auVar5._0_8_ = auVar7._0_8_ / auVar6._0_8_;
      auVar5._8_8_ = auVar7._8_8_;
      auVar6 = auVar5;
      local_78 = auVar5._0_8_;
      if (local_6c != 0) {
        auVar8._8_8_ = 0;
        auVar8._0_8_ = auVar5._0_8_;
        auVar6 = vfmadd213sd_fma(ZEXT816(0x4060000000000000),auVar8,ZEXT816(0xbff0000000000000));
        auVar7 = vcvtusi2sd_avx512f(ZEXT816(0xbff0000000000000),1 << ((byte)local_84 & 0x1f));
        auVar6._0_8_ = auVar6._0_8_ / (auVar5._0_8_ * auVar7._0_8_);
        if (auVar5._0_8_ < auVar6._0_8_) {
          local_78 = auVar6._0_8_;
        }
        auVar6._8_8_ = 0;
      }
      auVar7 = vcvtusi2sd_avx512f(auVar6,local_84);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_78;
      auVar6 = vcvtusi2sd_avx512f(auVar6,local_1c);
      auVar7 = vfmadd213sd_fma(auVar6,auVar9,auVar7);
      dVar4 = auVar7._0_8_;
      in_ZMM1 = ZEXT864((ulong)dVar4);
      if (dVar4 <= local_80) {
        local_68 = local_84;
        local_80 = dVar4;
      }
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_80;
      uVar1 = local_84;
    }
    local_4 = local_68;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__a);
  }
  return local_4;
}

Assistant:

static uint32_t determineBestBase(const DATATYPE *in, size_t size,
                                    const uint32_t maxb) {
    if (size == 0)
      return 0;
    const size_t defaultsamplesize = 64 * 1024;
    // the original paper describes sorting
    // a sample, but this only makes sense if you
    // are coding a frame of reference.
    size_t samplesize = size > defaultsamplesize ? defaultsamplesize : size;
    std::vector<uint32_t> freqs(33);
    // we choose the sample to be consecutive
    uint32_t rstart =
        size > samplesize
            ? (rand() % (static_cast<uint32_t>(size - samplesize)))
            : 0U;
    for (uint32_t k = rstart; k < rstart + samplesize; ++k) {
      freqs[asmbits(in[k])]++;
    }
    uint32_t bestb = maxb;
    uint32_t numberofexceptions = 0;
    double Erate = 0;
    double bestcost = maxb;
    for (uint32_t b = bestb - 1; b < maxb; --b) {
      numberofexceptions += freqs[b + 1];
      Erate = static_cast<double>(numberofexceptions) /
              static_cast<double>(samplesize);
      /**
       * though this is not explicit in the original paper, you
       * need to somehow compensate for compulsory exceptions
       * when the chosen number of bits is small.
       *
       * We use their formula (3.1.5) to estimate actual number
       * of total exceptions, including compulsory exceptions.
       */
      if (numberofexceptions > 0) {
        double altErate = (Erate * 128 - 1) / (Erate * (1U << b));
        if (altErate > Erate)
          Erate = altErate;
      }
      const double thiscost = b + Erate * maxb;
      if (thiscost <= bestcost) {
        bestcost = thiscost;
        bestb = b;
      }
    }
    return bestb;
  }